

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_accs(int datatype,void *scale,void *src_ptr,int *src_stride_ar,void *dst_ptr,
              int *dst_stride_ar,int *count,int stride_levels,int proc,comex_group_t group)

{
  int iVar1;
  int iVar2;
  int *message;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *__assertion;
  size_t sVar9;
  long lVar10;
  void *__src;
  int size;
  int world_proc;
  int local_b8 [2];
  undefined1 local_b0 [28];
  int local_94;
  undefined1 local_90 [24];
  int local_78 [9];
  int local_54 [9];
  
  iVar1 = comex_group_size(group,local_b8);
  if (iVar1 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < local_b8[0]) {
        if (group != 0) {
          comex_group_translate_world(group,proc,local_78);
          proc = local_78[0];
        }
        iVar1 = 1;
        if (0 < stride_levels) {
          uVar5 = 1;
          do {
            iVar1 = iVar1 * count[uVar5];
            uVar5 = uVar5 + 1;
          } while (stride_levels + 1 != uVar5);
        }
        local_b8[1] = 0;
        local_78[1] = 1;
        local_94 = 0;
        local_54[0] = 1;
        if (1 < stride_levels) {
          sVar9 = (ulong)(stride_levels - 1) << 2;
          lVar6 = 0;
          memset(local_b0,0,sVar9);
          memset(local_90,0,sVar9);
          iVar3 = 1;
          iVar4 = 1;
          do {
            iVar2 = count[lVar6 + 1];
            iVar4 = iVar4 * iVar2;
            local_78[lVar6 + 2] = iVar4;
            iVar3 = iVar3 * iVar2;
            local_54[lVar6 + 1] = iVar3;
            lVar6 = lVar6 + 1;
          } while ((ulong)(uint)stride_levels - 1 != lVar6);
        }
        if (0 < iVar1) {
          lVar6 = (ulong)(stride_levels + 1) - 1;
          iVar3 = 0;
          do {
            if (stride_levels < 1) {
              lVar10 = 0;
LAB_0015eab9:
              lVar7 = 0;
            }
            else {
              lVar7 = 0;
              lVar10 = 0;
              do {
                lVar10 = lVar10 + (long)src_stride_ar[lVar7] *
                                  (long)*(int *)(local_b0 + lVar7 * 4 + -4);
                iVar4 = *(int *)(local_b0 + lVar7 * 4 + -4) +
                        (uint)((iVar3 + 1) % local_78[lVar7 + 1] == 0);
                if (count[lVar7 + 1] <= iVar4) {
                  iVar4 = 0;
                }
                *(int *)(local_b0 + lVar7 * 4 + -4) = iVar4;
                lVar7 = lVar7 + 1;
              } while (lVar6 != lVar7);
              if (stride_levels < 1) goto LAB_0015eab9;
              lVar8 = 0;
              lVar7 = 0;
              do {
                lVar7 = lVar7 + (long)dst_stride_ar[lVar8] *
                                (long)*(int *)(local_90 + lVar8 * 4 + -4);
                iVar4 = *(int *)(local_90 + lVar8 * 4 + -4) +
                        (uint)((iVar3 + 1) % local_54[lVar8] == 0);
                if (count[lVar8 + 1] <= iVar4) {
                  iVar4 = 0;
                }
                *(int *)(local_90 + lVar8 * 4 + -4) = iVar4;
                lVar8 = lVar8 + 1;
              } while (lVar6 != lVar8);
            }
            if (5 < datatype - 0x25U) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                            ,0x2c2,"int _acc_nbi(void *, void *, int, int, int, void *)");
            }
            __src = (void *)(lVar10 + (long)src_ptr);
            iVar4 = *count;
            if (l_state.rank == proc) {
              _acc(datatype,iVar4,(void *)(lVar7 + (long)dst_ptr),__src,scale);
            }
            else {
              sVar9 = *(size_t *)(&DAT_001bace8 + (ulong)(datatype - 0x25U) * 8);
              iVar2 = (int)sVar9 + iVar4 + 0x28;
              message = (int *)_my_malloc((long)iVar2);
              *message = datatype + -0x22;
              *(void **)(message + 2) = (void *)(lVar7 + (long)dst_ptr);
              *(void **)(message + 4) = __src;
              message[6] = iVar4;
              message[8] = 0;
              message[9] = 0;
              memcpy(message + 10,scale,sVar9);
              memcpy((void *)((long)message + sVar9 + 0x28),__src,(long)iVar4);
              fence_array[proc] = '\x01';
              _mq_push(proc,(char *)message,iVar2);
              if (7 < l_state.mq_size) {
                comex_make_progress();
              }
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar1);
        }
        comex_make_progress();
        return 0;
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x3b1,
                "int comex_accs(int, void *, void *, int *, void *, int *, int *, int, int, comex_group_t)"
               );
}

Assistant:

int comex_accs(
        int datatype, void *scale,
        void *src_ptr, int *src_stride_ar,
        void *dst_ptr, int *dst_stride_ar,
        int *count, int stride_levels,
        int proc, comex_group_t group)
{
    int i, j;
    long src_idx, dst_idx;  /* index offset of current block position to ptr */
    int n1dim;  /* number of 1 dim block */
    int src_bvalue[7], src_bunit[7];
    int dst_bvalue[7], dst_bunit[7];

    CHECK_GROUP(group,proc);
#if DEBUG
    if (stride_levels) {
        printf("[%d] comex_accs(src_ptr=%p, src_stride_ar[0]=%d, dst_ptr=%p, dst_stride_ar[0]=%d, count[0]=%d, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, src_stride_ar[0], dst_ptr, dst_stride_ar[0], count[0], stride_levels, proc);
    }
    else {
        printf("[%d] comex_accs(src_ptr=%p, src_stride_ar=NULL, dst_ptr=%p, dst_stride_ar=NULL, count=NULL, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, dst_ptr, stride_levels, proc);
    }
#endif

    /* number of n-element of the first dimension */
    n1dim = 1;
    for(i=1; i<=stride_levels; i++) {
        n1dim *= count[i];
    }

    /* calculate the destination indices */
    src_bvalue[0] = 0; src_bvalue[1] = 0; src_bunit[0] = 1; src_bunit[1] = 1;
    dst_bvalue[0] = 0; dst_bvalue[1] = 0; dst_bunit[0] = 1; dst_bunit[1] = 1;

    for(i=2; i<=stride_levels; i++) {
        src_bvalue[i] = 0;
        dst_bvalue[i] = 0;
        src_bunit[i] = src_bunit[i-1] * count[i-1];
        dst_bunit[i] = dst_bunit[i-1] * count[i-1];
    }

    /* index mangling */
    for(i=0; i<n1dim; i++) {
        src_idx = 0;
        dst_idx = 0;
        for(j=1; j<=stride_levels; j++) {
	  src_idx += (long) src_bvalue[j] * (long) src_stride_ar[j-1];
            if((i+1) % src_bunit[j] == 0) {
                src_bvalue[j]++;
            }
            if(src_bvalue[j] > (count[j]-1)) {
                src_bvalue[j] = 0;
            }
        }

        for(j=1; j<=stride_levels; j++) {
	  dst_idx += (long) dst_bvalue[j] * (long) dst_stride_ar[j-1];
            if((i+1) % dst_bunit[j] == 0) {
                dst_bvalue[j]++;
            }
            if(dst_bvalue[j] > (count[j]-1)) {
                dst_bvalue[j] = 0;
            }
        }
        
        _acc_nbi((char *)src_ptr + src_idx, 
                (char *)dst_ptr + dst_idx, count[0], proc,
                datatype, scale);
    }

    comex_wait_proc(proc, group);

    return COMEX_SUCCESS;
}